

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O2

int run_test_udp_multicast_join6(void)

{
  int iVar1;
  short *psVar2;
  uv_loop_t *puVar3;
  long lVar4;
  undefined8 uVar5;
  char *pcVar6;
  bool bVar7;
  int count;
  sockaddr_in6 addr;
  
  iVar1 = uv_interface_addresses((uv_interface_address_t **)&addr,&count);
  if (iVar1 == 0) {
    psVar2 = (short *)(addr._0_8_ + 0x14);
    bVar7 = false;
    for (lVar4 = 0; (!bVar7 && (lVar4 < count)); lVar4 = lVar4 + 1) {
      bVar7 = false;
      if (*psVar2 == 10) {
        bVar7 = *(int *)(psVar2 + -2) == 0;
      }
      psVar2 = psVar2 + 0x28;
    }
    uv_free_interface_addresses((uv_interface_address_t *)addr._0_8_,count);
    if (bVar7) {
      iVar1 = uv_ip6_addr("::",0x23a3,&addr);
      if (iVar1 != 0) {
        pcVar6 = "0 == uv_ip6_addr(\"::\", TEST_PORT, &addr)";
        uVar5 = 0xb0;
LAB_001644fd:
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-multicast-join6.c"
                ,uVar5,pcVar6);
        abort();
      }
      puVar3 = uv_default_loop();
      iVar1 = uv_udp_init(puVar3,&server);
      if (iVar1 != 0) {
        pcVar6 = "r == 0";
        uVar5 = 0xb3;
        goto LAB_001644fd;
      }
      puVar3 = uv_default_loop();
      iVar1 = uv_udp_init(puVar3,&client);
      if (iVar1 != 0) {
        pcVar6 = "r == 0";
        uVar5 = 0xb6;
        goto LAB_001644fd;
      }
      iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
      if (iVar1 != 0) {
        pcVar6 = "r == 0";
        uVar5 = 0xba;
        goto LAB_001644fd;
      }
      iVar1 = uv_udp_set_membership(&server,"ff02::1",(char *)0x0,UV_JOIN_GROUP);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
        if (iVar1 == 0) {
          iVar1 = do_send(&req);
          if (iVar1 == 0) {
            if (close_cb_called == 0) {
              if (cl_recv_cb_called == 0) {
                if (sv_send_cb_called == 0) {
                  puVar3 = uv_default_loop();
                  uv_run(puVar3,UV_RUN_DEFAULT);
                  if (cl_recv_cb_called == 2) {
                    if (sv_send_cb_called == 2) {
                      if (close_cb_called == 2) {
                        puVar3 = uv_default_loop();
                        close_loop(puVar3);
                        puVar3 = uv_default_loop();
                        iVar1 = uv_loop_close(puVar3);
                        if (iVar1 == 0) {
                          return 0;
                        }
                        pcVar6 = "0 == uv_loop_close(uv_default_loop())";
                        uVar5 = 0xd5;
                      }
                      else {
                        pcVar6 = "close_cb_called == 2";
                        uVar5 = 0xd3;
                      }
                    }
                    else {
                      pcVar6 = "sv_send_cb_called == 2";
                      uVar5 = 0xd2;
                    }
                  }
                  else {
                    pcVar6 = "cl_recv_cb_called == 2";
                    uVar5 = 0xd1;
                  }
                }
                else {
                  pcVar6 = "sv_send_cb_called == 0";
                  uVar5 = 0xcc;
                }
              }
              else {
                pcVar6 = "cl_recv_cb_called == 0";
                uVar5 = 0xcb;
              }
            }
            else {
              pcVar6 = "close_cb_called == 0";
              uVar5 = 0xca;
            }
          }
          else {
            pcVar6 = "r == 0";
            uVar5 = 200;
          }
        }
        else {
          pcVar6 = "r == 0";
          uVar5 = 0xc5;
        }
        goto LAB_001644fd;
      }
      if (iVar1 != -0x13) {
        pcVar6 = "r == 0";
        uVar5 = 0xc2;
        goto LAB_001644fd;
      }
      puVar3 = uv_default_loop();
      close_loop(puVar3);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 != 0) {
        pcVar6 = "0 == uv_loop_close(uv_default_loop())";
        uVar5 = 0xbe;
        goto LAB_001644fd;
      }
      pcVar6 = "No ipv6 multicast route";
      goto LAB_00164293;
    }
  }
  pcVar6 = "No external IPv6 interface available";
LAB_00164293:
  fprintf(_stderr,"%s\n",pcVar6);
  fflush(_stderr);
  return 1;
}

Assistant:

TEST_IMPL(udp_multicast_join6) {
  int r;
  struct sockaddr_in6 addr;

  if (!can_ipv6_external())
    RETURN_SKIP("No external IPv6 interface available");

  ASSERT(0 == uv_ip6_addr("::", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_JOIN_GROUP);
  if (r == UV_ENODEV) {
    MAKE_VALGRIND_HAPPY();
    RETURN_SKIP("No ipv6 multicast route");
  }

  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);
  
  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}